

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O1

void __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::~Simplex_tree
          (Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *this)

{
  pointer pvVar1;
  
  root_members_recursive_deletion(this);
  pvVar1 = (this->filtration_vect_).
           super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pvVar1 != (pointer)0x0) {
    operator_delete(pvVar1,(long)(this->filtration_vect_).
                                 super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar1);
  }
  if ((this->root_).members_.m_flat_tree.m_data.m_seq.m_holder.m_capacity != 0) {
    operator_delete((this->root_).members_.m_flat_tree.m_data.m_seq.m_holder.m_start);
  }
  std::
  _Hashtable<int,_std::pair<const_int,_boost::intrusive::list<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::member_hook<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>,_&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>,_boost::intrusive::constant_time_size<false>_>_>,_std::allocator<std::pair<const_int,_boost::intrusive::list<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::member_hook<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>,_&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>,_boost::intrusive::constant_time_size<false>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_boost::intrusive::list<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::member_hook<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>,_&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>,_boost::intrusive::constant_time_size<false>_>_>,_std::allocator<std::pair<const_int,_boost::intrusive::list<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::member_hook<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>,_&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>,_boost::intrusive::constant_time_size<false>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)this);
  return;
}

Assistant:

~Simplex_tree() {
    root_members_recursive_deletion();
  }